

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

VulkanObjectWrapper<VkSampler_T_*,_(VulkanUtilities::VulkanHandleTypeId)12> * __thiscall
VulkanUtilities::VulkanLogicalDevice::
CreateVulkanObject<VkSampler_T*,(VulkanUtilities::VulkanHandleTypeId)12,VkResult(*)(VkDevice_T*,VkSamplerCreateInfo_const*,VkAllocationCallbacks_const*,VkSampler_T**),VkSamplerCreateInfo>
          (VulkanObjectWrapper<VkSampler_T_*,_(VulkanUtilities::VulkanHandleTypeId)12>
           *__return_storage_ptr__,VulkanLogicalDevice *this,
          _func_VkResult_VkDevice_T_ptr_VkSamplerCreateInfo_ptr_VkAllocationCallbacks_ptr_VkSampler_T_ptr_ptr
          *VkCreateObject,VkSamplerCreateInfo *CreateInfo,char *DebugName,char *ObjectType)

{
  VkResult errorCode;
  char local_51;
  VkSampler_T *VkObject;
  char *DebugName_local;
  char *ObjectType_local;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  char *local_28;
  
  DebugName_local = DebugName;
  if (DebugName == (char *)0x0) {
    DebugName_local = "";
  }
  VkObject = (VkSampler_T *)0x0;
  ObjectType_local = ObjectType;
  errorCode = (*VkCreateObject)(this->m_VkDevice,CreateInfo,this->m_VkAllocator,&VkObject);
  if (errorCode != VK_SUCCESS) {
    local_51 = '\'';
    local_28 = VkResultToString(errorCode);
    Diligent::LogError<true,char[25],char_const*,char[3],char_const*,char,char[17],char_const*>
              (false,"CreateVulkanObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xad,(char (*) [25])"Failed to create Vulkan ",&ObjectType_local,
               (char (*) [3])0x6b7dd2,&DebugName_local,&local_51,(char (*) [17])"\nVK Error Code: ",
               &local_28);
  }
  if (*DebugName_local != '\0') {
    SetVulkanObjectName<VkSampler_T*,(VulkanUtilities::VulkanHandleTypeId)12>
              (this->m_VkDevice,VkObject,DebugName_local);
  }
  std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,void>
            ((__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2> *)
             &local_38,
             (__weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *)this);
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_38;
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_30;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  __return_storage_ptr__->m_VkObject = VkObject;
  VkObject = (VkSampler_T *)0x0;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanObjectWrapper<VkObjectType, VkTypeId> VulkanLogicalDevice::CreateVulkanObject(VkCreateObjectFuncType        VkCreateObject,
                                                                                    const VkObjectCreateInfoType& CreateInfo,
                                                                                    const char*                   DebugName,
                                                                                    const char*                   ObjectType) const
{
    if (DebugName == nullptr)
        DebugName = "";

    VkObjectType VkObject = VK_NULL_HANDLE;

    VkResult err = VkCreateObject(m_VkDevice, &CreateInfo, m_VkAllocator, &VkObject);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create Vulkan ", ObjectType, " '", DebugName, '\'');

    if (*DebugName != 0)
        SetVulkanObjectName<VkObjectType, VkTypeId>(m_VkDevice, VkObject, DebugName);

    return VulkanObjectWrapper<VkObjectType, VkTypeId>{GetSharedPtr(), std::move(VkObject)};
}